

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interp.cc
# Opt level: O3

Result RunSpecificExports(Ptr *instance,Errors *errors,
                         vector<FunctionCall,_std::allocator<FunctionCall>_> *calls)

{
  size_t __n;
  int iVar1;
  Result RVar2;
  pointer pFVar3;
  pointer pFVar4;
  ExternType *pEVar5;
  pointer pEVar6;
  Enum EVar7;
  byte bVar8;
  string_view name;
  Values results;
  undefined7 in_stack_ffffffffffffff30;
  Ptr local_c8;
  Values local_a8;
  pointer local_88;
  vector<FunctionCall,_std::allocator<FunctionCall>_> *local_80;
  Ptr *local_78;
  pointer local_70;
  FuncType *local_68;
  RefPtr<wabt::interp::Func> local_60;
  RefPtr<wabt::interp::Module> local_48;
  
  local_80 = calls;
  local_78 = instance;
  wabt::interp::RefPtr<wabt::interp::Module>::RefPtr
            (&local_48,&s_store,(Ref)(instance->obj_->module_).index);
  pEVar6 = ((local_48.obj_)->desc_).exports.
           super__Vector_base<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_88 = ((local_48.obj_)->desc_).exports.
             super__Vector_base<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  EVar7 = Ok;
  if (pEVar6 != local_88) {
    do {
      pFVar4 = (local_80->super__Vector_base<FunctionCall,_std::allocator<FunctionCall>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pFVar3 = (local_80->super__Vector_base<FunctionCall,_std::allocator<FunctionCall>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      local_70 = pFVar3;
      if (pFVar4 != pFVar3) {
        do {
          __n = (pEVar6->type).name._M_string_length;
          if ((__n == (pFVar4->name)._M_string_length) &&
             ((__n == 0 ||
              (iVar1 = bcmp((pEVar6->type).name._M_dataplus._M_p,(pFVar4->name)._M_dataplus._M_p,__n
                           ), iVar1 == 0)))) {
            pEVar5 = (pEVar6->type).type._M_t.
                     super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
                     .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl;
            if (pEVar5->kind != First) {
              printf("Export \'%s\' is not a function\n",(pEVar6->type).name._M_dataplus._M_p);
LAB_00110671:
              exit(1);
            }
            if (s_trace_stream != (Stream *)0x0) {
              wabt::Stream::Writef
                        (s_trace_stream,">>> running export \"%s\":\n",
                         (pFVar4->name)._M_dataplus._M_p);
              pEVar5 = (pEVar6->type).type._M_t.
                       super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
                       .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl;
              if (pEVar5->kind != First) {
                __assert_fail("isa<Derived>(base)",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/cast.h"
                              ,0x4e,
                              "Derived *wabt::cast(Base *) [Derived = wabt::interp::FuncType, Base = wabt::interp::ExternType]"
                             );
              }
            }
            if ((int)((ulong)(*(long *)&pEVar5[1].kind - (long)pEVar5[1]._vptr_ExternType) >> 3) !=
                (int)((ulong)((long)(pFVar4->args).
                                    super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pFVar4->args).
                                   super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4)) {
              printf("Exported function \'%s\' expects %d arguments, but %d were provided\n",
                     (pEVar6->type).name._M_dataplus._M_p);
              goto LAB_00110671;
            }
            local_68 = (FuncType *)&pFVar4->args;
            wabt::interp::RefPtr<wabt::interp::Func>::RefPtr
                      (&local_60,&s_store,
                       (Ref)(local_78->obj_->funcs_).
                            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                            ._M_impl.super__Vector_impl_data._M_start[pEVar6->index].index);
            local_a8.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_a8.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_a8.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_c8.root_index_ = 0;
            local_c8.obj_ = (Trap *)0x0;
            local_c8.store_ = (Store *)0x0;
            RVar2 = wabt::interp::Func::Call
                              (local_60.obj_,&s_store,&pFVar4->args,&local_a8,&local_c8,
                               s_trace_stream);
            bVar8 = RVar2.enum_ == Error;
            name._M_str = (char *)pEVar5;
            name._M_len = (size_t)(pEVar6->type).name._M_dataplus._M_p;
            wabt::interp::WriteCall
                      ((interp *)
                       s_stdout_stream._M_t.
                       super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                       .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl,
                       (Stream *)(pEVar6->type).name._M_string_length,name,local_68,&local_a8,
                       (Values *)&local_c8,(Ptr *)CONCAT17(bVar8,in_stack_ffffffffffffff30));
            if (local_c8.obj_ != (Trap *)0x0) {
              wabt::interp::Store::DeleteRoot(local_c8.store_,local_c8.root_index_);
            }
            if (local_a8.
                super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_a8.
                              super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_a8.
                                    super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_a8.
                                    super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_60.obj_ != (Func *)0x0) {
              wabt::interp::Store::DeleteRoot(local_60.store_,local_60.root_index_);
            }
            EVar7 = (Enum)(EVar7 == Error | bVar8);
            pFVar3 = local_70;
          }
          pFVar4 = pFVar4 + 1;
        } while (pFVar4 != pFVar3);
      }
      pEVar6 = pEVar6 + 1;
    } while (pEVar6 != local_88);
    if (local_48.obj_ == (Module *)0x0) {
      return (Result)EVar7;
    }
  }
  wabt::interp::Store::DeleteRoot(local_48.store_,local_48.root_index_);
  return (Result)EVar7;
}

Assistant:

Result RunSpecificExports(const Instance::Ptr& instance,
                          Errors* errors,
                          std::vector<FunctionCall>& calls) {
  Result result = Result::Ok;

  auto module = s_store.UnsafeGet<Module>(instance->module());
  auto&& module_desc = module->desc();

  for (auto&& export_ : module_desc.exports) {
    for (auto& call_ : calls) {
      if (export_.type.name == call_.name) {
        ERROR_EXIT_UNLESS(export_.type.type->kind == ExternalKind::Func,
                          "Export '%s' is not a function\n",
                          export_.type.name.c_str());

        if (s_trace_stream) {
          s_trace_stream->Writef(">>> running export \"%s\":\n",
                                 call_.name.c_str());
        }
        auto* func_type = cast<FuncType>(export_.type.type.get());
        int params_size = func_type->params.size();
        int args_size = call_.args.size();
        ERROR_EXIT_UNLESS(params_size == args_size,
                          "Exported function '%s' expects %d arguments, but %d "
                          "were provided\n",
                          export_.type.name.c_str(), params_size, args_size);

        auto func = s_store.UnsafeGet<Func>(instance->funcs()[export_.index]);
        Values results;
        Trap::Ptr trap;
        result |=
            func->Call(s_store, call_.args, results, &trap, s_trace_stream);
        WriteCall(s_stdout_stream.get(), export_.type.name, *func_type,
                  call_.args, results, trap);
      }
    }
  }

  return result;
}